

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * __thiscall
pbrt::Image::Crop(Image *__return_storage_ptr__,Image *this,Bounds2i *bounds,Allocator alloc)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  size_t sVar5;
  int iVar6;
  Point2i resolution;
  ulong uVar7;
  int iVar8;
  Point2i p;
  int iVar9;
  Image *this_00;
  uint uVar10;
  Tuple2<pbrt::Point2,_int> TVar11;
  Tuple2<pbrt::Point2,_int> p_00;
  Bounds2i *__range1;
  Float value;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  ulong local_60;
  int vb;
  int va;
  Tuple2<pbrt::Point2,_int> local_48;
  Image *local_40;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  uVar3 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  uVar10 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  vb = 0;
  iVar9 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y - uVar10;
  resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x - uVar3;
  va = iVar9 * resolution.super_Tuple2<pbrt::Point2,_int>.x;
  if (va < 1) {
    LogFatal<char_const(&)[14],char_const(&)[2],char_const(&)[14],int&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x54a,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [14])"bounds.Area()",
               (char (*) [2])0x621a47,(char (*) [14])"bounds.Area()",&va,(char (*) [2])0x621a47,&vb)
    ;
  }
  if (-1 < (int)(uVar10 | uVar3)) {
    pbVar2 = (this->channelNames).ptr;
    local_38.bits =
         (this->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->channelNames).field_2;
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar4 = pbVar2;
    }
    resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar9;
    channels.n = (this->channelNames).nStored;
    channels.ptr = pbVar4;
    local_40 = this;
    Image(__return_storage_ptr__,this->format,resolution,channels,(ColorEncodingHandle *)&local_38,
          alloc);
    local_48 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>;
    uVar3 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x;
    iVar9 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y;
    local_60 = (ulong)local_48 >> 0x20;
    iVar6 = local_48.y;
    iVar8 = iVar9;
    if (iVar9 <= iVar6) {
      iVar8 = iVar6;
    }
    if (iVar6 < iVar9 && local_48.x < (int)uVar3) {
      sVar5 = (local_40->channelNames).nStored;
      uVar7 = (ulong)local_48 & 0xffffffff;
      TVar11 = (Tuple2<pbrt::Point2,_int>)((ulong)local_48 & 0xffffffff);
      this_00 = local_40;
      p_00 = local_48;
      do {
        if (0 < (int)sVar5) {
          iVar9 = 0;
          do {
            iVar6 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
            iVar1 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
            value = GetChannel(this_00,(Point2i)p_00,iVar9,(WrapMode2D)0x200000002);
            p.super_Tuple2<pbrt::Point2,_int>.x = TVar11.x - iVar6;
            p.super_Tuple2<pbrt::Point2,_int>.y = (int)local_60 - iVar1;
            SetChannel(__return_storage_ptr__,p,iVar9,value);
            iVar9 = iVar9 + 1;
            sVar5 = (local_40->channelNames).nStored;
            this_00 = local_40;
          } while (iVar9 < (int)sVar5);
          uVar7 = (ulong)(uint)(bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
          uVar3 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x;
        }
        uVar10 = TVar11.x + 1;
        TVar11 = (Tuple2<pbrt::Point2,_int>)
                 ((uVar7 | (ulong)p_00 & 0xffffffff00000000) + 0x100000000);
        if (uVar10 != uVar3) {
          TVar11 = (Tuple2<pbrt::Point2,_int>)(((ulong)p_00 & 0xffffffff00000000) + (ulong)uVar10);
        }
        local_60 = (ulong)TVar11 >> 0x20;
        p_00 = TVar11;
      } while ((local_48.x != TVar11.x) || (iVar8 != TVar11.y));
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[41]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x54b,"Check failed: %s",(char (*) [41])"bounds.pMin.x >= 0 && bounds.pMin.y >= 0");
}

Assistant:

Image Image::Crop(const Bounds2i &bounds, Allocator alloc) const {
    CHECK_GT(bounds.Area(), 0);
    CHECK(bounds.pMin.x >= 0 && bounds.pMin.y >= 0);
    Image image(format, Point2i(bounds.pMax - bounds.pMin), channelNames, encoding,
                alloc);
    for (Point2i p : bounds)
        for (int c = 0; c < NChannels(); ++c)
            image.SetChannel(Point2i(p - bounds.pMin), c, GetChannel(p, c));
    return image;
}